

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::SubpixelPrecisionIsRespectedWhileRendering(RendererTests *this)

{
  cell *pcVar1;
  bool bVar2;
  int iVar3;
  cell *pcVar4;
  cell *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  scanline_cells sVar9;
  scanline_cells sVar10;
  mask<11UL> mask2;
  mask<7UL> mask1;
  cell cells21 [2];
  cell cells11 [2];
  scanline_cells cells2 [1];
  scanline_cells cells1 [1];
  scanline_mockup local_158;
  LocationInfo local_130;
  undefined1 local_108 [40];
  string local_e0;
  mask<7UL> local_c0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 local_60 [8];
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_58;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_48;
  
  local_158.excepted_y = -1000000;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_158._25_8_ = 0;
  local_158._current_y = 0x7fffffff;
  local_48.second = (cell *)local_60;
  local_78._0_8_ = 0;
  local_78._8_8_ = 0xb00000011;
  local_68 = 0xffffffef00000000;
  local_48.first = (cell *)local_78;
  mocks::mask<7ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<7ul> *)&local_c0,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_48,0xd);
  if (0 < local_c0._height) {
    iVar7 = local_c0._min_y;
    do {
      sVar9 = mocks::mask<7UL>::operator[](&local_c0,iVar7);
      pcVar5 = sVar9.second;
      pcVar4 = sVar9.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_158,iVar7);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar6 = 0;
LAB_0016d236:
          iVar8 = pcVar4->x;
          iVar3 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar3 = iVar3 + pcVar1->area;
            uVar6 = uVar6 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar8);
          if (iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_158,iVar8,uVar6 * 0x100 - iVar3);
            iVar8 = iVar8 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar3 = pcVar4->x - iVar8;
            if ((uVar6 & 0xffffff) != 0 && iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_158,iVar8,iVar3,uVar6 * 0x100);
            }
            goto LAB_0016d236;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_158);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_c0._height + local_c0._min_y);
  }
  local_130.filename._M_dataplus._M_p = (pointer)&local_130.filename.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_108,&local_130.filename,0x196);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [1])&DAT_001a0ab0,&local_158.spans_log,(LocationInfo *)local_108);
  if ((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_) != local_108 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_108._4_4_,local_108._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != &local_130.filename.field_2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  local_58.second = (cell *)local_80;
  local_98._0_8_ = 2;
  local_98._8_8_ = 0xa00000011;
  local_88 = 0xffffffef00000000;
  local_58.first = (cell *)local_98;
  mocks::mask<11ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,1>
            ((mask<11ul> *)local_108,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [1])
             &local_58,0x17);
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ =
       SUB81(local_158.spans_log.
             super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_158.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ =
       (undefined7)
       ((ulong)local_158.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start >> 8);
  if (0 < (int)local_108._8_4_) {
    iVar7 = local_108._4_4_;
    do {
      sVar10 = mocks::mask<11UL>::operator[]((mask<11UL> *)local_108,iVar7);
      pcVar5 = sVar10.second;
      pcVar4 = sVar10.first;
      bVar2 = anon_unknown_1::scanline_mockup::begin(&local_158,iVar7);
      if (bVar2) {
        if (pcVar4 != pcVar5) {
          uVar6 = 0;
LAB_0016d3d4:
          iVar8 = pcVar4->x;
          iVar3 = 0;
          pcVar1 = pcVar4;
          do {
            pcVar4 = pcVar1 + 1;
            iVar3 = iVar3 + pcVar1->area;
            uVar6 = uVar6 + pcVar1->cover;
            if (pcVar4 == pcVar5) break;
            pcVar1 = pcVar4;
          } while (pcVar4->x == iVar8);
          if (iVar3 != 0) {
            anon_unknown_1::scanline_mockup::add_cell(&local_158,iVar8,uVar6 * 0x1000 - iVar3);
            iVar8 = iVar8 + 1;
          }
          if (pcVar4 != pcVar5) {
            iVar3 = pcVar4->x - iVar8;
            if ((uVar6 & 0xfffff) != 0 && iVar3 != 0) {
              anon_unknown_1::scanline_mockup::add_span(&local_158,iVar8,iVar3,uVar6 * 0x1000);
            }
            goto LAB_0016d3d4;
          }
        }
        anon_unknown_1::scanline_mockup::commit(&local_158);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (int)(local_108._8_4_ + local_108._4_4_));
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_130,&local_e0,0x1a7);
  ut::
  are_equal<agge::tests::(anonymous_namespace)::span,1ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
            ((span (*) [1])&DAT_001a0ac0,&local_158.spans_log,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != &local_130.filename.field_2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if ((void *)local_108._16_8_ != (void *)0x0) {
    operator_delete((void *)local_108._16_8_);
  }
  if (local_c0._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158.spans_log.
      super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

scanline_mockup(bool inprogress = true)
					: excepted_y(-1000000), _inprogress(inprogress), _current_y(0x7fffffff)
				{	}